

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

int CheckForMissingSegs(void)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__s;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 local_50 [24];
  double linelen;
  int i_1;
  DVector2 vec1;
  seg_t *seg;
  int i;
  int missing;
  double *added_seglen;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)numsides;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar2);
  seg._4_4_ = 0;
  memset(__s,0,(long)numsides << 3);
  for (seg._0_4_ = 0; (int)seg < numsegs; seg._0_4_ = (int)seg + 1) {
    vec1.Y = (double)(segs + (int)seg);
    if (((seg_t *)vec1.Y)->sidedef != (side_t *)0x0) {
      dVar4 = vertex_t::fX(((seg_t *)vec1.Y)->v2);
      dVar5 = vertex_t::fX(*(vertex_t **)vec1.Y);
      dVar6 = vertex_t::fY(*(vertex_t **)((long)vec1.Y + 8));
      dVar7 = vertex_t::fY(*(vertex_t **)vec1.Y);
      TVector2<double>::TVector2
                ((TVector2<double> *)&stack0xffffffffffffffd0,dVar4 - dVar5,dVar6 - dVar7);
      dVar4 = TVector2<double>::Length((TVector2<double> *)&stack0xffffffffffffffd0);
      lVar3 = (*(long *)((long)vec1.Y + 0x10) - (long)sides) / 0xc0;
      *(double *)((long)__s + lVar3 * 8) = dVar4 + *(double *)((long)__s + lVar3 * 8);
    }
  }
  for (linelen._4_4_ = 0; linelen._4_4_ < numsides; linelen._4_4_ = linelen._4_4_ + 1) {
    line_t::Delta((line_t *)local_50);
    local_50._16_8_ = TVector2<double>::Length((TVector2<double> *)local_50);
    seg._4_4_ = (uint)(*(double *)((long)__s + (long)linelen._4_4_ * 8) <
                      (double)local_50._16_8_ - 1.0) + seg._4_4_;
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  return seg._4_4_;
}

Assistant:

static int CheckForMissingSegs()
{
	double *added_seglen = new double[numsides];
	int missing = 0;

	memset(added_seglen, 0, sizeof(double)*numsides);
	for(int i=0;i<numsegs;i++)
	{
		seg_t * seg = &segs[i];

		if (seg->sidedef!=NULL)
		{
			// check all the segs and calculate the length they occupy on their sidedef
			DVector2 vec1(seg->v2->fX() - seg->v1->fX(), seg->v2->fY() - seg->v1->fY());
			added_seglen[seg->sidedef - sides] += vec1.Length();
		}
	}

	for(int i=0;i<numsides;i++)
	{
		double linelen = sides[i].linedef->Delta().Length();
		missing += (added_seglen[i] < linelen - 1.);
	}

	delete [] added_seglen;
	return missing;
}